

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::pair_range_nested
          (basic_substring<const_char> *this,CC open,CC close)

{
  ro_substr chars;
  basic_substring<const_char> bVar1;
  bool bVar2;
  error_flags eVar3;
  undefined1 *start;
  char in_DL;
  char in_SIL;
  long *in_RDI;
  char both [3];
  size_t count;
  size_t curr;
  size_t e;
  size_t b;
  char in_stack_ffffffffffffff2f;
  basic_substring<const_char> *in_stack_ffffffffffffff30;
  long *s_;
  basic_substring<const_char> *in_stack_ffffffffffffff50;
  char local_9b [2];
  char local_99;
  long local_98;
  basic_substring<const_char> *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff88;
  basic_substring<const_char> local_68;
  char *local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined4 local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  char *local_10;
  size_t local_8;
  
  local_20 = (undefined1 *)find(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f,0x3d6e11);
  if (local_20 == (undefined1 *)0xffffffffffffffff) {
    basic_substring(&local_68);
  }
  else {
    start = local_20 + 1;
    local_98 = 0;
    local_99 = '\0';
    while( true ) {
      basic_substring<char_const>::basic_substring<3ul>
                ((basic_substring<char_const> *)&stack0xffffffffffffff50,(char (*) [3])local_9b);
      chars.len._0_6_ = in_stack_ffffffffffffff88;
      chars.str = local_20;
      chars.len._6_1_ = in_DL;
      chars.len._7_1_ = in_SIL;
      in_stack_ffffffffffffff78 =
           (basic_substring<const_char> *)first_of(in_stack_ffffffffffffff78,chars,(size_t)start);
      if (in_stack_ffffffffffffff78 == (basic_substring<const_char> *)0xffffffffffffffff) break;
      if (*(char *)((long)&in_stack_ffffffffffffff78->str + *in_RDI) == in_SIL) {
        local_98 = local_98 + 1;
        start = (undefined1 *)((long)&in_stack_ffffffffffffff78->str + 1);
      }
      else if (*(char *)((long)&in_stack_ffffffffffffff78->str + *in_RDI) == in_DL) {
        if (local_98 == 0) {
          local_28 = (undefined1 *)((long)&in_stack_ffffffffffffff78->str + 1);
          s_ = in_RDI;
          if ((undefined1 *)in_RDI[1] < local_20) {
            eVar3 = get_error_flags();
            if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            local_38 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_30 = 0x1544;
            handle_error(0x3f0daf,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
          }
          if (local_28 == (undefined1 *)0xffffffffffffffff) {
            local_28 = (undefined1 *)in_RDI[1];
          }
          if (local_28 < local_20) {
            eVar3 = get_error_flags();
            if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            local_48 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_40 = 0x1546;
            handle_error(0x3f0daf,(char *)0x1546,"check failed: %s","first <= last");
          }
          if ((undefined1 *)in_RDI[1] < local_28) {
            eVar3 = get_error_flags();
            if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            local_58 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_50 = 0x1547;
            handle_error(0x3f0daf,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
          }
          basic_substring(in_stack_ffffffffffffff50,(char *)s_,(size_t)in_RDI);
          local_68.str = local_10;
          local_68.len = local_8;
          goto LAB_003d716f;
        }
        local_98 = local_98 + -1;
        start = (undefined1 *)((long)&in_stack_ffffffffffffff78->str + 1);
      }
    }
    basic_substring(&local_68);
  }
LAB_003d716f:
  bVar1.len = local_68.len;
  bVar1.str = local_68.str;
  return bVar1;
}

Assistant:

basic_substring pair_range_nested(CC open, CC close) const
    {
        size_t b = find(open);
        if(b == npos) return basic_substring();
        size_t e, curr = b+1, count = 0;
        const char both[] = {open, close, '\0'};
        while((e = first_of(both, curr)) != npos)
        {
            if(str[e] == open)
            {
                ++count;
                curr = e+1;
            }
            else if(str[e] == close)
            {
                if(count == 0) return range(b, e+1);
                --count;
                curr = e+1;
            }
        }
        return basic_substring();
    }